

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

void __thiscall
baryonyx::itm::quadratic_cost_type<double>::
make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
          (quadratic_cost_type<double> *this,int n,
          linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *rng)

{
  double p2y;
  int iVar1;
  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
  _Var2;
  pointer ppVar3;
  bool bVar4;
  type piVar5;
  type pdVar6;
  reference pvVar7;
  iterator iVar8;
  difference_type dVar9;
  pointer ppVar10;
  iterator iVar11;
  difference_type value_00;
  double dVar12;
  int local_150;
  int i_1;
  double value;
  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
  local_f0;
  pair<double,_int> *local_e8;
  pair<double,_int> *local_e0;
  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
  local_d8;
  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
  local_d0;
  pair<double,_int> *local_c8;
  pair<double,_int> *local_c0;
  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
  local_b8;
  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
  local_b0;
  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
  next;
  iterator end;
  iterator begin;
  pair<double,_int> local_80;
  int local_70;
  allocator<std::pair<baryonyx::itm::quadratic_cost_type<double>::quad,_int>_> local_69;
  int i;
  vector<std::pair<baryonyx::itm::quadratic_cost_type<double>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<double>::quad,_int>_>_>
  q;
  allocator<std::pair<double,_int>_> local_39;
  undefined1 local_38 [8];
  vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> r;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *rng_local;
  int n_local;
  quadratic_cost_type<double> *this_local;
  
  r.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)rng;
  std::allocator<std::pair<double,_int>_>::allocator(&local_39);
  std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::vector
            ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)local_38,
             (long)n,&local_39);
  std::allocator<std::pair<double,_int>_>::~allocator(&local_39);
  piVar5 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[](&this->indices,(long)n);
  iVar1 = *piVar5;
  std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<double>::quad,_int>_>::allocator
            (&local_69);
  std::
  vector<std::pair<baryonyx::itm::quadratic_cost_type<double>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<double>::quad,_int>_>_>
  ::vector((vector<std::pair<baryonyx::itm::quadratic_cost_type<double>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<double>::quad,_int>_>_>
            *)&i,(long)iVar1,&local_69);
  std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<double>::quad,_int>_>::~allocator
            (&local_69);
  for (local_70 = 0; local_70 != n; local_70 = local_70 + 1) {
    pdVar6 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                       (&this->linear_elements,(long)local_70);
    std::pair<double,_int>::pair<double_&,_int_&,_true>(&local_80,pdVar6,&local_70);
    pvVar7 = std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::
             operator[]((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
                        local_38,(long)local_70);
    std::pair<double,_int>::operator=(pvVar7,&local_80);
  }
  iVar8 = std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::begin
                    ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
                     local_38);
  std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::end
            ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)local_38);
  std::
  sort<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,baryonyx::itm::quadratic_cost_type<double>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>
            (iVar8._M_current);
  end = std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::begin
                  ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
                   local_38);
  next._M_current =
       (pair<double,_int> *)
       std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::end
                 ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
                  local_38);
  local_b8._M_current =
       (pair<double,_int> *)
       std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::begin
                 ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
                  local_38);
  local_b0 = __gnu_cxx::
             __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
             ::operator++(&local_b8,0);
  while (bVar4 = __gnu_cxx::
                 operator==<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                           (&local_b0,&next), ((bVar4 ^ 0xffU) & 1) != 0) {
    ppVar10 = __gnu_cxx::
              __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
              ::operator->(&local_b0);
    dVar12 = ppVar10->first;
    ppVar10 = __gnu_cxx::
              __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
              ::operator->(&end);
    if ((dVar12 != ppVar10->first) || (NAN(dVar12) || NAN(ppVar10->first))) {
      local_c0 = end._M_current;
      local_c8 = local_b0._M_current;
      dVar9 = std::
              distance<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>>
                        ((__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                          )end._M_current,local_b0);
      ppVar3 = r.
               super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      if (1 < dVar9) {
        local_d0._M_current = end._M_current;
        local_d8._M_current = local_b0._M_current;
        ppVar10 = __gnu_cxx::
                  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                  ::operator->(&end);
        dVar12 = ppVar10->first;
        ppVar10 = __gnu_cxx::
                  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                  ::operator->(&local_b0);
        random_epsilon_unique<double,__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>>
                  (local_d0,local_d8,(random_engine *)ppVar3,dVar12,ppVar10->first);
      }
      end._M_current = local_b0._M_current;
    }
    __gnu_cxx::
    __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
    ::operator++(&local_b0);
  }
  local_e0 = end._M_current;
  local_e8 = next._M_current;
  dVar9 = std::
          distance<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>>
                    ((__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                      )end._M_current,next);
  if (1 < dVar9) {
    local_f0._M_current =
         (pair<double,_int> *)
         std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::begin
                   ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
                    local_38);
    bVar4 = __gnu_cxx::
            operator==<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                      (&end,&local_f0);
    ppVar3 = r.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    iVar8 = end;
    _Var2 = next;
    if (bVar4) {
      ppVar10 = __gnu_cxx::
                __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                ::operator->(&end);
      dVar12 = ppVar10->first;
      ppVar10 = __gnu_cxx::
                __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                ::operator->(&end);
      random_epsilon_unique<double,__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>>
                ((__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                  )iVar8._M_current,_Var2,(random_engine *)ppVar3,dVar12,ppVar10->first + 1.0);
    }
    else {
      pvVar7 = std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::front
                         ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                           *)local_38);
      dVar12 = pvVar7->first;
      iVar8 = std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::begin
                        ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *
                         )local_38);
      dVar9 = std::
              distance<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>>
                        ((__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                          )iVar8._M_current,
                         (__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                          )end._M_current);
      ppVar10 = __gnu_cxx::
                __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                ::operator->(&end);
      p2y = ppVar10->first;
      iVar8 = std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::begin
                        ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *
                         )local_38);
      iVar11 = std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::end
                         ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                           *)local_38);
      value_00 = std::
                 distance<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>>
                           ((__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                             )iVar8._M_current,
                            (__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                             )iVar11._M_current);
      dVar12 = linearize<long,double>(0,dVar12,dVar9,p2y,value_00);
      ppVar3 = r.
               super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      iVar8 = end;
      _Var2 = next;
      ppVar10 = __gnu_cxx::
                __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                ::operator->(&end);
      random_epsilon_unique<double,__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>>
                ((__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                  )iVar8._M_current,_Var2,(random_engine *)ppVar3,ppVar10->first,dVar12);
    }
  }
  iVar8 = std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::begin
                    ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
                     local_38);
  iVar11 = std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::end
                     ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
                      local_38);
  std::
  sort<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,baryonyx::itm::quadratic_cost_type<double>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_2_>
            (iVar8._M_current,iVar11._M_current);
  for (local_150 = 0; local_150 != n; local_150 = local_150 + 1) {
    pvVar7 = std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::
             operator[]((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
                        local_38,(long)local_150);
    dVar12 = pvVar7->first;
    pdVar6 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                       (&this->linear_elements,(long)local_150);
    *pdVar6 = dVar12;
  }
  make_loo_norm(this,n);
  std::
  vector<std::pair<baryonyx::itm::quadratic_cost_type<double>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<double>::quad,_int>_>_>
  ::~vector((vector<std::pair<baryonyx::itm::quadratic_cost_type<double>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<double>::quad,_int>_>_>
             *)&i);
  std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::~vector
            ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)local_38);
  return;
}

Assistant:

void make_random_norm(int n, Random& rng)
    {
        std::vector<std::pair<Float, int>> r(n);
        std::vector<std::pair<quad, int>> q(indices[n]);

        for (int i = 0; i != n; ++i)
            r[i] = { linear_elements[i], i };

        std::sort(r.begin(), r.end(), [](const auto& lhs, const auto& rhs) {
            return lhs.first < rhs.first;
        });

        {
            auto begin = r.begin();
            auto end = r.end();
            auto next = r.begin()++;
            for (; next != end; ++next) {
                if (next->first != begin->first) {
                    if (std::distance(begin, next) > 1)
                        random_epsilon_unique(
                          begin, next, rng, begin->first, next->first);

                    begin = next;
                }
            }

            if (std::distance(begin, end) > 1) {
                if (begin == r.begin()) {
                    random_epsilon_unique(
                      begin, end, rng, begin->first, begin->first + 1);
                } else {
                    auto value = linearize(std::ptrdiff_t(0),
                                           r.front().first,
                                           std::distance(r.begin(), begin),
                                           begin->first,
                                           std::distance(r.begin(), r.end()));

                    random_epsilon_unique(
                      begin, end, rng, begin->first, value);
                }
            }

            // Reorder the vector according to the variable index, so,
            // it restores the initial order.

            std::sort(
              r.begin(), r.end(), [](const auto& lhs, const auto& rhs) {
                  return lhs.second < rhs.second;
              });
        }

        {
            // auto begin = q.begin();
            // auto end = q.end();
            // auto next = q.begin()++;
            // for (; next != end; ++next) {
            //     if (next->first != begin->first) {
            //         if (std::distance(begin, next) > 1)
            //             random_epsilon_unique(
            //               begin, next, rng, begin->first,
            //               next->first);

            //         begin = next;
            //     }
            // }

            // if (std::distance(begin, end) > 1) {
            //     if (begin == q.begin()) {
            //         random_epsilon_unique(
            //           begin, end, rng, begin->first, begin->first +
            //           1);
            //     } else {
            //         auto value = linearize(std::ptrdiff_t(0),
            //                                q.front().first,
            //                                std::distance(q.begin(),
            //                                begin), begin->first,
            //                                std::distance(q.begin(),
            //                                q.end()));

            //         random_epsilon_unique(
            //           begin, end, rng, begin->first, value);
            //     }
            // }

            // Reorder the vector according to the variable index, so,
            // it restores the initial order.

            // std::sort(
            //   q.begin(), q.end(), [](const auto& lhs, const auto&
            //   rhs) {
            //       return lhs.second < rhs.second;
            //   });
        }

        for (int i = 0; i != n; ++i)
            linear_elements[i] = r[i].first;
        // for (int i = 0; i != n; ++i) {
        //     quadratic_elements[i].factor = r[i].first.factor;

        // Finally we compute the l+oo norm.
        make_loo_norm(n);
    }